

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  xmlSchemaPtr schemas_00;
  size_t sVar5;
  char *__s;
  ulong uStack_8a8;
  char count;
  size_t i;
  glob_t globbuf;
  char err [500];
  char local_658 [8];
  char result [500];
  undefined1 local_458 [8];
  char prefix [500];
  char local_258 [8];
  char pattern [500];
  int ret;
  int len;
  int res;
  xmlSchemaPtr schemas;
  xmlSchemaParserCtxtPtr ctxt;
  char *instance;
  char *base2;
  char *base;
  int options_local;
  char *errr_local;
  char *resul_local;
  char *filename_local;
  
  pcVar3 = baseFilename(filename);
  ret = 0;
  uVar4 = xmlSchemaNewParserCtxt(filename);
  xmlSchemaSetParserErrors(uVar4,testErrorHandler,testErrorHandler,uVar4);
  schemas_00 = (xmlSchemaPtr)xmlSchemaParse(uVar4);
  xmlSchemaFreeParserCtxt(uVar4);
  sVar5 = strlen(pcVar3);
  pattern._496_4_ = (undefined4)sVar5;
  if (((int)pattern._496_4_ < 500) && (4 < (int)pattern._496_4_)) {
    iVar2 = pattern._496_4_ + -4;
    if (pcVar3[pattern._496_4_ + -6] == '_') {
      iVar2 = pattern._496_4_ + -6;
    }
    pattern._496_4_ = iVar2;
    if (pcVar3[pattern._496_4_ + -2] == '_') {
      pattern._496_4_ = pattern._496_4_ + -2;
    }
    memcpy(local_458,pcVar3,(long)(int)pattern._496_4_);
    local_458[(int)pattern._496_4_] = 0;
    iVar2 = snprintf(local_258,499,"./test/schemas/%s_?.xml",local_458);
    if (0x1f2 < iVar2) {
      pattern[0x1eb] = '\0';
    }
    if (pcVar3[(int)pattern._496_4_] == '_') {
      pattern._496_4_ = pattern._496_4_ + 2;
      memcpy(local_458,pcVar3,(long)(int)pattern._496_4_);
      local_458[(int)pattern._496_4_] = 0;
    }
    globbuf.gl_pathv = (char **)0x0;
    glob64(local_258,8,(__errfunc *)0x0,(glob64_t *)&i);
    for (uStack_8a8 = 0; uStack_8a8 < i; uStack_8a8 = uStack_8a8 + 1) {
      testErrorsSize = 0;
      testErrors[0] = '\0';
      pcVar3 = *(char **)(globbuf.gl_pathc + uStack_8a8 * 8);
      __s = baseFilename(pcVar3);
      sVar5 = strlen(__s);
      pattern._496_4_ = (undefined4)sVar5;
      if (((int)pattern._496_4_ < 7) || (__s[pattern._496_4_ + -6] != '_')) {
        fprintf(_stderr,"don\'t know how to process %s\n",pcVar3);
      }
      else {
        cVar1 = __s[pattern._496_4_ + -5];
        pattern._492_4_ =
             snprintf(local_658,499,"result/schemas/%s_%c",local_458,(ulong)(uint)(int)cVar1);
        if (0x1f2 < (int)pattern._492_4_) {
          result[0x1eb] = '\0';
        }
        pattern._492_4_ =
             snprintf((char *)&globbuf.gl_stat,499,"result/schemas/%s_%c.err",local_458,
                      (ulong)(uint)(int)cVar1);
        if (schemas_00 != (xmlSchemaPtr)0x0) {
          nb_tests = nb_tests + 1;
          pattern._492_4_ =
               schemasOneTest(filename,pcVar3,local_658,(char *)&globbuf.gl_stat,options,schemas_00)
          ;
          if (pattern._492_4_ != 0) {
            ret = pattern._492_4_;
          }
        }
      }
    }
    globfree64((glob64_t *)&i);
    xmlSchemaFree(schemas_00);
    filename_local._4_4_ = ret;
  }
  else {
    xmlSchemaFree(schemas_00);
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = 0;
	testErrors[0] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/schemas/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas == NULL) {
	} else {
	    nb_tests++;
	    ret = schemasOneTest(filename, instance, result, err,
	                         options, schemas);
	    if (ret != 0)
		res = ret;
	}
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}